

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.h
# Opt level: O3

uint64_t __thiscall flatbuffers::BinaryAnnotator::GetElementSize(BinaryAnnotator *this,Field *field)

{
  ushort uVar1;
  ulong uVar2;
  Field *pFVar3;
  uint64_t uVar4;
  long lVar5;
  Schema *pSVar6;
  unsigned_short vtsize;
  long lVar7;
  Schema *pSVar8;
  
  lVar5 = -(long)*(int *)field;
  uVar1 = *(ushort *)(field + -(long)*(int *)field);
  if ((uVar1 < 7) || (uVar2 = (ulong)*(ushort *)(field + lVar5 + 6), uVar2 == 0)) {
    pFVar3 = (Field *)0x0;
  }
  else {
    pFVar3 = field + *(uint *)(field + uVar2) + uVar2;
  }
  if (((6 < *(ushort *)(pFVar3 + -(long)*(int *)pFVar3)) &&
      ((ulong)*(ushort *)(pFVar3 + (6 - (long)*(int *)pFVar3)) != 0)) &&
     ((int)(char)pFVar3[*(ushort *)(pFVar3 + (6 - (long)*(int *)pFVar3))].super_Table - 1U < 0xc)) {
    if ((uVar1 < 7) || (uVar2 = (ulong)*(ushort *)(field + lVar5 + 6), uVar2 == 0)) {
      pFVar3 = (Field *)0x0;
    }
    else {
      pFVar3 = field + *(uint *)(field + uVar2) + uVar2;
    }
    if ((*(ushort *)(pFVar3 + -(long)*(int *)pFVar3) < 7) ||
       ((ulong)*(ushort *)(pFVar3 + (6 - (long)*(int *)pFVar3)) == 0)) {
      uVar2 = 0;
    }
    else {
      uVar2 = (ulong)(uint)(int)(char)pFVar3[*(ushort *)(pFVar3 + (6 - (long)*(int *)pFVar3))].
                                      super_Table;
    }
    return (&GetTypeSize(reflection::BaseType)::sizes)[uVar2];
  }
  if ((uVar1 < 7) || (uVar2 = (ulong)*(ushort *)(field + lVar5 + 6), uVar2 == 0)) {
    pFVar3 = (Field *)0x0;
  }
  else {
    pFVar3 = field + *(uint *)(field + uVar2) + uVar2;
  }
  uVar4 = 4;
  if (((6 < *(ushort *)(pFVar3 + -(long)*(int *)pFVar3)) &&
      ((ulong)*(ushort *)(pFVar3 + (6 - (long)*(int *)pFVar3)) != 0)) &&
     (pFVar3[*(ushort *)(pFVar3 + (6 - (long)*(int *)pFVar3))].super_Table == (Table)0xf)) {
    pSVar8 = this->schema_;
    if ((*(ushort *)(pSVar8 + -(long)*(int *)pSVar8) < 5) ||
       (uVar2 = (ulong)*(ushort *)(pSVar8 + (4 - (long)*(int *)pSVar8)), uVar2 == 0)) {
      pSVar8 = (Schema *)0x0;
    }
    else {
      pSVar8 = pSVar8 + *(uint *)(pSVar8 + uVar2) + uVar2;
    }
    if ((uVar1 < 7) || (uVar2 = (ulong)*(ushort *)(field + lVar5 + 6), uVar2 == 0)) {
      pFVar3 = (Field *)0x0;
    }
    else {
      pFVar3 = field + *(uint *)(field + uVar2) + uVar2;
    }
    if (((*(ushort *)(pFVar3 + -(long)*(int *)pFVar3) < 9) ||
        ((ulong)*(ushort *)(pFVar3 + (8 - (long)*(int *)pFVar3)) == 0)) ||
       (*(uint *)pSVar8 <= *(uint *)(pFVar3 + *(ushort *)(pFVar3 + (8 - (long)*(int *)pFVar3))))) {
      __assert_fail("i < size()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/include/flatbuffers/vector.h"
                    ,0xc1,
                    "return_type flatbuffers::Vector<flatbuffers::Offset<reflection::Object>>::Get(SizeT) const [T = flatbuffers::Offset<reflection::Object>, SizeT = unsigned int]"
                   );
    }
    uVar2 = (ulong)(*(uint *)(pFVar3 + *(ushort *)(pFVar3 + (8 - (long)*(int *)pFVar3))) << 2);
    lVar5 = *(uint *)(pSVar8 + uVar2 + 4) + uVar2;
    pSVar6 = pSVar8 + lVar5 + 4;
    if (8 < *(ushort *)(pSVar6 + -(long)*(int *)pSVar6)) {
      lVar7 = -(long)*(int *)pSVar6;
      if (((ulong)*(ushort *)(pSVar8 + lVar7 + lVar5 + 0xc) != 0) &&
         (pSVar6[*(ushort *)(pSVar8 + lVar7 + lVar5 + 0xc)].super_Table != (Table)0x0)) {
        if ((*(ushort *)(pSVar6 + -(long)*(int *)pSVar6) < 0xd) ||
           ((ulong)*(ushort *)(pSVar8 + lVar7 + lVar5 + 0x10) == 0)) {
          return 0;
        }
        uVar4 = (uint64_t)*(int *)(pSVar6 + *(ushort *)(pSVar8 + lVar7 + lVar5 + 0x10));
      }
    }
  }
  return uVar4;
}

Assistant:

T ReadScalar(const void *p) {
  return EndianScalar(*reinterpret_cast<const T *>(p));
}